

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O2

void __thiscall
booster::hold_ptr<booster::log::sinks::syslog::data>::~hold_ptr
          (hold_ptr<booster::log::sinks::syslog::data> *this)

{
  data *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (data *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}